

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char * SoapySDRDevice_getTimeSource(SoapySDRDevice *device)

{
  char *__s;
  long *in_RDI;
  exception *ex;
  string local_30 [32];
  long *local_10;
  char *local_8;
  
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  (**(code **)(*local_10 + 0x260))(local_30);
  __s = (char *)std::__cxx11::string::c_str();
  local_8 = strdup(__s);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

char *SoapySDRDevice_getTimeSource(const SoapySDRDevice *device)
{
    __SOAPY_SDR_C_TRY
    return strdup(device->getTimeSource().c_str());
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}